

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktRasterizationTests.cpp
# Opt level: O2

TestInstance * __thiscall
vkt::rasterization::anon_unknown_0::
WidenessTestCase<vkt::rasterization::(anonymous_namespace)::PointTestInstance>::createInstance
          (WidenessTestCase<vkt::rasterization::(anonymous_namespace)::PointTestInstance> *this,
          Context *context)

{
  ostringstream *this_00;
  PrimitiveWideness PVar1;
  BaseRenderingTestInstance *this_01;
  VkPhysicalDeviceFeatures *pVVar2;
  VkPhysicalDeviceProperties *pVVar3;
  MessageBuilder *pMVar4;
  NotSupportedError *pNVar5;
  deUint32 *this_02;
  float *value;
  MessageBuilder local_1b0;
  
  this_01 = (BaseRenderingTestInstance *)operator_new(0x2b0);
  PVar1 = this->m_wideness;
  BaseRenderingTestInstance::BaseRenderingTestInstance
            (this_01,context,(this->super_BaseRenderingTestCase).m_sampleCount,0x100);
  (this_01->super_TestInstance)._vptr_TestInstance = (_func_int **)&PTR__PointTestInstance_00bdc650;
  this_01[1].super_TestInstance._vptr_TestInstance = (_func_int **)0x300000000;
  *(PrimitiveWideness *)&this_01[1].super_TestInstance.m_context = PVar1;
  *(undefined1 *)((long)&this_01[1].super_TestInstance.m_context + 4) = 1;
  this_01[1].m_renderSize = 0x3f800000;
  this_02 = &this_01[1].m_subpixelBits;
  this_01[1].m_subpixelBits = 0;
  this_01[1].m_multisampling = 0;
  this_01[1].m_imageFormat = VK_FORMAT_UNDEFINED;
  this_01[1].m_textureFormat.order = R;
  *(undefined8 *)&this_01[1].m_textureFormat.type = 0;
  if (PVar1 == PRIMITIVEWIDENESS_WIDE) {
    pVVar2 = Context::getDeviceFeatures((this_01->super_TestInstance).m_context);
    if (pVVar2->largePoints == 0) {
      pNVar5 = (NotSupportedError *)__cxa_allocate_exception(0x38);
      tcu::NotSupportedError::NotSupportedError
                (pNVar5,"large point support required",(char *)0x0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/rasterization/vktRasterizationTests.cpp"
                 ,0x4cb);
      __cxa_throw(pNVar5,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
    }
    pVVar3 = Context::getDeviceProperties(context);
    local_1b0.m_log = ((this_01->super_TestInstance).m_context)->m_testCtx->m_log;
    this_00 = &local_1b0.m_str;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)this_00);
    std::operator<<((ostream *)this_00,"GL_ALIASED_POINT_SIZE_RANGE = [");
    pMVar4 = tcu::MessageBuilder::operator<<(&local_1b0,(pVVar3->limits).pointSizeRange);
    std::operator<<((ostream *)&pMVar4->m_str,", ");
    value = (pVVar3->limits).pointSizeRange + 1;
    pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,value);
    std::operator<<((ostream *)&pMVar4->m_str,"]");
    tcu::MessageBuilder::operator<<(pMVar4,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)this_00);
    if (*value <= 1.0) {
      pNVar5 = (NotSupportedError *)__cxa_allocate_exception(0x38);
      tcu::NotSupportedError::NotSupportedError
                (pNVar5,"wide point support required",(char *)0x0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/rasterization/vktRasterizationTests.cpp"
                 ,0x4d3);
      __cxa_throw(pNVar5,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
    }
    local_1b0.m_log._0_4_ = 0x41200000;
    std::vector<float,_std::allocator<float>_>::emplace_back<float>
              ((vector<float,_std::allocator<float>_> *)this_02,(float *)&local_1b0);
    local_1b0.m_log = (TestLog *)CONCAT44(local_1b0.m_log._4_4_,0x41c80000);
    std::vector<float,_std::allocator<float>_>::emplace_back<float>
              ((vector<float,_std::allocator<float>_> *)this_02,(float *)&local_1b0);
    std::vector<float,_std::allocator<float>_>::push_back
              ((vector<float,_std::allocator<float>_> *)this_02,value);
    this_01[1].m_renderSize = (deUint32)*value;
  }
  else if (PVar1 == PRIMITIVEWIDENESS_NARROW) {
    local_1b0.m_log = (TestLog *)CONCAT44(local_1b0.m_log._4_4_,0x3f800000);
    std::vector<float,_std::allocator<float>_>::resize
              ((vector<float,_std::allocator<float>_> *)this_02,3,(value_type_conflict2 *)&local_1b0
              );
  }
  return &this_01->super_TestInstance;
}

Assistant:

virtual TestInstance*		createInstance		(Context& context) const
								{
									return new ConcreteTestInstance(context, m_wideness, m_sampleCount);
								}